

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O0

int64_t spvtools::opt::anon_unknown_15::GreatestCommonDivisor(int64_t a,int64_t b)

{
  int64_t iVar1;
  int64_t b_local;
  int64_t a_local;
  
  a_local = a;
  if (((a != b) && (a_local = b, a != 0)) && (a_local = a, b != 0)) {
    if ((a % 2 == 0) && (b % 2 == 0)) {
      iVar1 = GreatestCommonDivisor(a / 2,b / 2);
      a_local = iVar1 << 1;
    }
    else if ((a % 2 == 0) && (b % 2 == 1)) {
      a_local = GreatestCommonDivisor(a / 2,b);
    }
    else if ((a % 2 == 1) && (b % 2 == 0)) {
      a_local = GreatestCommonDivisor(a,b / 2);
    }
    else if (b < a) {
      a_local = GreatestCommonDivisor((a - b) / 2,b);
    }
    else {
      a_local = GreatestCommonDivisor((b - a) / 2,a);
    }
  }
  return a_local;
}

Assistant:

int64_t GreatestCommonDivisor(int64_t a, int64_t b) {
  // Simple cases
  if (a == b) {
    return a;
  } else if (a == 0) {
    return b;
  } else if (b == 0) {
    return a;
  }

  // Both even
  if (a % 2 == 0 && b % 2 == 0) {
    return 2 * GreatestCommonDivisor(a / 2, b / 2);
  }

  // Even a, odd b
  if (a % 2 == 0 && b % 2 == 1) {
    return GreatestCommonDivisor(a / 2, b);
  }

  // Odd a, even b
  if (a % 2 == 1 && b % 2 == 0) {
    return GreatestCommonDivisor(a, b / 2);
  }

  // Both odd, reduce the larger argument
  if (a > b) {
    return GreatestCommonDivisor((a - b) / 2, b);
  } else {
    return GreatestCommonDivisor((b - a) / 2, a);
  }
}